

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86.cpp
# Opt level: O0

void ncnn::softmax(float *_ptr,int elemcount,int elempack,int stride,int size1,float *_maxptr,
                  float *_sumptr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int in_EDX;
  int in_R8D;
  undefined8 *in_R9;
  float *in_stack_00000008;
  int in_stack_0000001c;
  __m256 _zero_avx;
  int j_1;
  float *sumptr;
  __m128 _negmax;
  __m256 _negmax_avx;
  int j;
  float *maxptr;
  float *in_stack_00000458;
  float *in_stack_00000460;
  int in_stack_0000046c;
  int in_stack_00000470;
  int in_stack_00000474;
  float *in_stack_00000478;
  float *in_stack_000007a0;
  float *in_stack_000007a8;
  int in_stack_000007b4;
  int in_stack_000007b8;
  int in_stack_000007bc;
  float *in_stack_000007c0;
  int local_23c;
  float *local_238;
  int local_1f4;
  undefined8 *local_1f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_1f4 = 0;
  auVar1 = vinsertps_avx(ZEXT416(0xff7fffff),ZEXT416(0xff7fffff),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(0xff7fffff),0x20);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(0xff7fffff),0x30);
  auVar2 = vinsertps_avx(ZEXT416(0xff7fffff),ZEXT416(0xff7fffff),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0xff7fffff),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0xff7fffff),0x30);
  local_c0 = auVar2._0_8_;
  uStack_b8 = auVar2._8_8_;
  uStack_b0 = auVar1._0_8_;
  uStack_a8 = auVar1._8_8_;
  local_1f0 = in_R9;
  for (; local_1f4 + 7 < in_R8D; local_1f4 = local_1f4 + 8) {
    *local_1f0 = local_c0;
    local_1f0[1] = uStack_b8;
    local_1f0[2] = uStack_b0;
    local_1f0[3] = uStack_a8;
    local_1f0 = local_1f0 + 4;
  }
  for (; local_1f4 + 3 < in_R8D; local_1f4 = local_1f4 + 4) {
    *local_1f0 = 0xff7fffffff7fffff;
    local_1f0[1] = 0xff7fffffff7fffff;
    local_1f0 = local_1f0 + 2;
  }
  for (; local_1f4 < in_R8D; local_1f4 = local_1f4 + 1) {
    *(undefined4 *)local_1f0 = 0xff7fffff;
    local_1f0 = (undefined8 *)((long)local_1f0 + 4);
  }
  local_23c = 0;
  auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
  auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
  local_80 = auVar2._0_8_;
  uStack_78 = auVar2._8_8_;
  uStack_70 = auVar1._0_8_;
  uStack_68 = auVar1._8_8_;
  local_238 = in_stack_00000008;
  for (; local_23c + 7 < in_R8D; local_23c = local_23c + 8) {
    *(undefined8 *)local_238 = local_80;
    *(undefined8 *)(local_238 + 2) = uStack_78;
    *(undefined8 *)(local_238 + 4) = uStack_70;
    *(undefined8 *)(local_238 + 6) = uStack_68;
    local_238 = local_238 + 8;
  }
  for (; local_23c + 3 < in_R8D; local_23c = local_23c + 4) {
    local_238[0] = 0.0;
    local_238[1] = 0.0;
    local_238[2] = 0.0;
    local_238[3] = 0.0;
    local_238 = local_238 + 4;
  }
  for (; local_23c < in_R8D; local_23c = local_23c + 1) {
    *local_238 = 0.0;
    local_238 = local_238 + 1;
  }
  if (in_EDX == 8) {
    softmax_pack8(in_stack_000007c0,in_stack_000007bc,in_stack_000007b8,in_stack_000007b4,
                  in_stack_000007a8,in_stack_000007a0);
  }
  if (in_EDX == 4) {
    softmax_pack4(in_stack_00000478,in_stack_00000474,in_stack_00000470,in_stack_0000046c,
                  in_stack_00000460,in_stack_00000458);
  }
  if (in_EDX == 1) {
    softmax_pack1((float *)_zero_avx._8_8_,(int)_zero_avx[1],(int)_zero_avx[0],in_stack_0000001c,
                  _sumptr,in_stack_00000008);
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int elemcount, int elempack, int stride, int size1, float* _maxptr, float* _sumptr)
{
    // reduce max
    {
        float* maxptr = _maxptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _negmax_avx512 = _mm512_set1_ps(-FLT_MAX);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(maxptr, _negmax_avx512);
            maxptr += 16;
        }
#endif // __AVX512F__
        __m256 _negmax_avx = _mm256_set1_ps(-FLT_MAX);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(maxptr, _negmax_avx);
            maxptr += 8;
        }
#endif // __AVX__
        __m128 _negmax = _mm_set1_ps(-FLT_MAX);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(maxptr, _negmax);
            maxptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *maxptr++ = -FLT_MAX;
        }
    }

    // reduce exp(x - max)
    {
        float* sumptr = _sumptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_set1_ps(0.f);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(sumptr, _zero_avx512);
            sumptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_set1_ps(0.f);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(sumptr, _zero_avx);
            sumptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_set1_ps(0.f);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(sumptr, _zero);
            sumptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *sumptr++ = 0.f;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        softmax_pack16(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        softmax_pack8(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX__
    if (elempack == 4)
    {
        softmax_pack4(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __SSE2__
    if (elempack == 1)
    {
        softmax_pack1(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
}